

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  __pid_t _Var3;
  int fd;
  int **sv;
  int *piVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  size_t sVar7;
  int i_1;
  ulong uVar8;
  int i;
  long lVar9;
  char buf [1];
  int clientfd;
  string result_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  request;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  table;
  char message [64];
  undefined1 local_135;
  int local_134;
  char *local_130;
  size_t local_128;
  char local_120;
  undefined7 uStack_11f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  string local_f8;
  int *local_d8;
  string local_d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b0;
  sockaddr local_78 [4];
  
  sv = (int **)operator_new__(0x20);
  lVar9 = 0;
  do {
    piVar4 = (int *)operator_new__(8);
    sv[lVar9] = piVar4;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  lVar9 = 0;
  do {
    iVar1 = socketpair(1,1,0,sv[lVar9]);
    if (iVar1 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"socketpair",10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar9);
      std::operator<<(poVar6,'\n');
      exit(1);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  _Var2 = getpid();
  puVar5 = (undefined8 *)mmap((void *)0x0,0x10,3,0x21,-1,0);
  if (puVar5 == (undefined8 *)0x0) {
    main_cold_1();
  }
  else {
    *puVar5 = 0;
    puVar5[1] = 0;
    lVar9 = 0;
    do {
      _Var3 = getpid();
      if (_Var3 == _Var2) {
        _Var3 = fork();
        if (_Var3 != 0) {
          if (_Var3 < 0) {
            perror("fork failed");
          }
          else {
            *(__pid_t *)((long)puVar5 + lVar9 * 4) = _Var3;
            sleep(1);
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    _Var3 = getpid();
    if (_Var3 != _Var2) {
      lVar9 = 0;
      do {
        _Var2 = getpid();
        if (_Var2 == *(int *)((long)puVar5 + lVar9 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Work child N ",0xd);
          _Var2 = getpid();
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
          local_78[0].sa_family._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_78,1);
          workercloser((int)lVar9,sv);
          local_d8 = sv[lVar9];
          close(local_d8[1]);
          do {
            local_135 = 0x61;
            sock_fd_read(*local_d8,&local_135,1,&local_134);
            recv(local_134,local_78,0x40,0x4000);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Child proccess N ",0x11);
            _Var2 = getpid();
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," > ",3);
            sVar7 = strlen((char *)local_78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_78,sVar7);
            local_130 = (char *)CONCAT71(local_130._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_130,1);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            sVar7 = strlen((char *)local_78);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,local_78,local_78[0].sa_data + (sVar7 - 2));
            request_parse(&local_110,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              lVar9 = 8;
              uVar8 = 0;
              do {
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    *(char **)((long)local_110.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              lVar9 + -8),
                                    *(long *)((long)&((local_110.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar9));
                local_130 = (char *)CONCAT71(local_130._1_7_,0x20);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_130,1);
                uVar8 = uVar8 + 1;
                lVar9 = lVar9 + 0x20;
              } while (uVar8 < (ulong)((long)local_110.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_110.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            local_128 = 0;
            local_120 = '\0';
            local_130 = &local_120;
            result_message(&local_d0,
                           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_b0,&local_110);
            std::__cxx11::string::operator=((string *)&local_130,(string *)&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,local_d0._M_dataplus._M_p._0_1_) !=
                &local_d0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                       local_d0._M_dataplus._M_p._0_1_),
                              local_d0.field_2._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"RESULT VALUE ",0xd);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_130,local_128);
            local_d0._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_d0,1);
            send(local_134,local_130,local_128,0x4000);
            shutdown(local_134,2);
            close(local_134);
            if (local_130 != &local_120) {
              operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_110);
          } while( true );
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_b0);
      return 0;
    }
  }
  lVar9 = 0;
  do {
    close(*sv[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  local_78[0].sa_family = 2;
  local_78[0].sa_data[0] = '#';
  local_78[0].sa_data[1] = '(';
  local_78[0].sa_data[2] = '\0';
  local_78[0].sa_data[3] = '\0';
  local_78[0].sa_data[4] = '\0';
  local_78[0].sa_data[5] = '\0';
  lVar9 = 0;
  iVar1 = socket(2,1,0);
  bind(iVar1,local_78,0x10);
  listen(iVar1,5);
  local_130 = (char *)CONCAT71(local_130._1_7_,0x61);
  do {
    do {
      fd = accept(iVar1,(sockaddr *)0x0,(socklen_t *)0x0);
      sock_fd_write(sv[lVar9][1],&local_130,1,fd);
      close(fd);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar9 = 0;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {


    try{


        int **sv = new int*[4];
        for(int i=0; i<4;i++){
            sv[i] = new int[2];
        }

        std::unordered_map<std::string, std::string> table;
    


        for(int i =0; i <4; i++){
            if(socketpair(AF_LOCAL, SOCK_STREAM, 0, sv[i]) < 0){
                std::cerr <<"socketpair" <<i <<'\n';
                exit(1);
            }
        }

        int pid;

        pid_t masterProc = getpid();

        pid_t *worker;

        worker =(pid_t *)mmap(0, MAX_PIDS*sizeof(pid_t),
                              PROT_READ|PROT_WRITE,
                              MAP_SHARED | MAP_ANONYMOUS, -1, 0);

        if(!worker){
            perror("mmap failed");
            exit(1);
        }

        memset((void *)worker, 0, MAX_PIDS*sizeof(pid_t));

        for(int i =0; i<4; i++){
            if(getpid() == masterProc){
                pid = fork();
                if(pid == 0){
                    continue;
                    //exit(0);
                }else if(pid < 0){
                    perror("fork failed");
                }else{
                    worker[i] = pid;
                    sleep(1);
                }
            }
        }

        if(getpid() == masterProc){

            for(int i=0;i < 4; i++){
                close(sv[i][0]);
            }

            //for(int i =0; i < 4; i++)
            //  printf("this child N %d\n", worker[i]);

            int listenfd, clientfd;

            struct sockaddr_in serv;
            serv.sin_family = AF_INET;
            serv.sin_port = htons(9000);
            serv.sin_addr.s_addr = INADDR_ANY;

            listenfd = socket(AF_INET, SOCK_STREAM, 0);

            bind(listenfd, (struct sockaddr *)&serv, sizeof(serv));

            listen(listenfd, 5);

            char mesage[1] ={'a'};


            while(true){
                for(int i = 0; i < 4 ; i++){
                    clientfd = accept(listenfd,NULL,NULL);
                    sock_fd_write(sv[i][1], mesage, 1, clientfd);
                    close(clientfd);
                    //reload session
                }
            }
            close(listenfd);
            int stat;
            for(int i=0; i < 4 ; i++){
                waitpid(worker[i],&stat,0);
            }


        }

        else{
            for(int i =0; i <4; i++){
                if(getpid() == worker[i]){
                    std::cout << "Work child N " <<getpid() <<'\n';
                    workercloser(i, sv);
                    close(sv[i][1]);

                    int clientfd;


                    for(;;){
                        char buf[1] = {'a'};
                        sock_fd_read(sv[i][0], buf, 1, &clientfd);

                        char message[64];
                        recv(clientfd, message, sizeof(message),
                             MSG_NOSIGNAL);

                     //   std::cout <<"YA PRINAL\n";
                        std::cout << "Child proccess N " <<getpid() << " > "
                                  << message <<'\n';

                        std::vector<std::string> request = request_parse(message);
                        for(int i=0;i < request.size();i++){
                            std::cout <<request[i] <<' ';
                        }std::cout <<"|" <<std::endl;
                        std::string result_str;
                        result_str = result_message(table, request);


                        std::cout << "RESULT VALUE " <<result_str << '\n';
                        send(clientfd, result_str.c_str(), result_str.length(), MSG_NOSIGNAL);

                        shutdown(clientfd, SHUT_RDWR);
                        close(clientfd);
                        //reload session
                    }
                }

            }
        }


    }catch(std::exception &e){
        std::cerr << "Exception " <<e.what() <<std::endl;
    }

    





    return 0;
}